

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

optional<bool>
unodb::detail::olc_impl_helpers::
remove_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode,
          byte key_byte,basic_art_key<unsigned_long> k,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_instance,
          read_critical_section *parent_critical_section,
          read_critical_section *node_critical_section,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          *node_in_parent,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          **child_in_parent,read_critical_section *child_critical_section,node_type *child_type,
          olc_node_ptr *child)

{
  atomic<long> *paVar1;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar2;
  byte bVar3;
  ulong uVar4;
  __int_type_conflict _Var5;
  __int_type_conflict _Var6;
  write_guard wVar7;
  bool bVar8;
  ushort uVar9;
  int iVar10;
  pthread_t pVar11;
  void *extraout_RDX;
  long lVar12;
  optimistic_lock *poVar13;
  undefined7 in_register_00000031;
  ushort uVar14;
  write_guard local_68;
  write_guard child_guard_1;
  __atomic_base<unsigned_long> local_58;
  write_guard node_guard;
  write_guard local_40;
  write_guard node_guard_1;
  write_guard child_guard;
  
  bVar3 = (inode->super_olc_inode_48_parent<unsigned_long,_std::span<const_std::byte>_>).
          child_indexes._M_elems[CONCAT71(in_register_00000031,key_byte) & 0xffffffff].value.
          super___atomic_base<unsigned_char>._M_i;
  if (bVar3 == 0xff) {
    poVar13 = parent_critical_section->lock;
    _Var5 = (parent_critical_section->version).version;
    if ((poVar13->read_lock_count).super___atomic_base<long>._M_i < 1) {
LAB_00229b75:
      __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
    }
    _Var6 = (poVar13->version).version.super___atomic_base<unsigned_long>._M_i;
    LOCK();
    paVar1 = &poVar13->read_lock_count;
    lVar12 = (paVar1->super___atomic_base<long>)._M_i;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
    UNLOCK();
    if (_Var5 != _Var6) goto LAB_00229a0e;
    if (lVar12 < 1) goto LAB_00229b94;
    parent_critical_section->lock = (optimistic_lock *)0x0;
    poVar13 = node_critical_section->lock;
    _Var5 = (node_critical_section->version).version;
    if ((poVar13->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00229b75;
    _Var6 = (poVar13->version).version.super___atomic_base<unsigned_long>._M_i;
    LOCK();
    paVar1 = &poVar13->read_lock_count;
    lVar12 = (paVar1->super___atomic_base<long>)._M_i;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
    UNLOCK();
    if (_Var5 == _Var6) {
      if (lVar12 < 1) goto LAB_00229b94;
      node_critical_section->lock = (optimistic_lock *)0x0;
LAB_00229904:
      uVar14 = 0x100;
      uVar9 = 0;
      goto LAB_0022990b;
    }
    if (lVar12 < 1) goto LAB_00229b94;
LAB_00229a2a:
    node_critical_section->lock = (optimistic_lock *)0x0;
  }
  else {
    piVar2 = (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
             ((long)&(inode->super_olc_inode_48_parent<unsigned_long,_std::span<const_std::byte>_>).
                     children + (ulong)bVar3 * 8);
    child->tagged_ptr = (piVar2->value)._M_i.tagged_ptr;
    bVar8 = optimistic_lock::check
                      (node_critical_section->lock,
                       (version_type)(node_critical_section->version).version);
    if (!bVar8) goto LAB_00229a2a;
    child_guard_1.lock = &db_instance->root_pointer_lock;
    optimistic_lock::try_read_lock((optimistic_lock *)&stack0xffffffffffffffa8);
    child_critical_section->lock = (optimistic_lock *)local_58._M_i;
    local_58._M_i = 0;
    (child_critical_section->version).version = (version_tag_type)node_guard.lock;
    optimistic_lock::read_critical_section::~read_critical_section
              ((read_critical_section *)&stack0xffffffffffffffa8);
    if (child_critical_section->lock != (optimistic_lock *)0x0) {
      uVar4 = child->tagged_ptr;
      *child_type = (node_type)uVar4 & (I256|I48);
      if ((uVar4 & 7) == 0) {
        iVar10 = basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::cmp
                           ((basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)
                            (uVar4 & 0xfffffffffffffff8),(void *)k.field_0,extraout_RDX);
        if (iVar10 == 0) {
          if ((inode->super_olc_inode_48_parent<unsigned_long,_std::span<const_std::byte>_>).
              field_0x20 != '\x11') {
            poVar13 = parent_critical_section->lock;
            _Var5 = (parent_critical_section->version).version;
            if ((poVar13->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00229b75;
            _Var6 = (poVar13->version).version.super___atomic_base<unsigned_long>._M_i;
            LOCK();
            paVar1 = &poVar13->read_lock_count;
            lVar12 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (_Var5 == _Var6) {
              if (lVar12 < 1) goto LAB_00229b94;
              uVar14 = 0;
              parent_critical_section->lock = (optimistic_lock *)0x0;
              bVar8 = optimistic_lock::try_upgrade_to_write_lock
                                (node_critical_section->lock,
                                 (version_type)(node_critical_section->version).version);
              local_58._M_i = 0;
              if (bVar8) {
                local_58._M_i = (__int_type_conflict)node_critical_section->lock;
              }
              node_critical_section->lock = (optimistic_lock *)0x0;
              if ((optimistic_lock *)local_58._M_i != (optimistic_lock *)0x0) {
                bVar8 = optimistic_lock::try_upgrade_to_write_lock
                                  (child_critical_section->lock,
                                   (version_type)(child_critical_section->version).version);
                uVar14 = 0;
                poVar13 = (optimistic_lock *)0x0;
                if (bVar8) {
                  poVar13 = child_critical_section->lock;
                }
                child_critical_section->lock = (optimistic_lock *)0x0;
                node_guard_1.lock = poVar13;
                if (poVar13 != (optimistic_lock *)0x0) {
                  optimistic_lock::atomic_version_type::write_unlock_and_obsolete(&poVar13->version)
                  ;
                  pVar11 = pthread_self();
                  (poVar13->obsoleter_thread)._M_thread = pVar11;
                  node_guard_1.lock = (optimistic_lock *)0x0;
                  olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
                  remove(inode,(char *)(ulong)key_byte);
                  *child_in_parent =
                       (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                        *)0x0;
                  uVar14 = 0x100;
                }
                optimistic_lock::write_guard::~write_guard(&node_guard_1);
              }
              optimistic_lock::write_guard::~write_guard((write_guard *)&stack0xffffffffffffffa8);
              goto LAB_002297a4;
            }
            goto LAB_00229a0e;
          }
          basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
          ::
          make_db_inode_unique_ptr<unodb::detail::olc_inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&>
                    ((basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
                      *)&stack0xffffffffffffffa8,(db_type *)child_guard_1.lock,inode);
          bVar8 = optimistic_lock::try_upgrade_to_write_lock
                            (parent_critical_section->lock,
                             (version_type)(parent_critical_section->version).version);
          node_guard_1.lock = (optimistic_lock *)0x0;
          if (bVar8) {
            node_guard_1.lock = parent_critical_section->lock;
          }
          parent_critical_section->lock = (optimistic_lock *)0x0;
          if (node_guard_1.lock != (optimistic_lock *)0x0) {
            bVar8 = optimistic_lock::try_upgrade_to_write_lock
                              (node_critical_section->lock,
                               (version_type)(node_critical_section->version).version);
            local_40.lock = (optimistic_lock *)0x0;
            if (bVar8) {
              local_40.lock = node_critical_section->lock;
            }
            node_critical_section->lock = (optimistic_lock *)0x0;
            if (local_40.lock != (optimistic_lock *)0x0) {
              bVar8 = optimistic_lock::try_upgrade_to_write_lock
                                (child_critical_section->lock,
                                 (version_type)(child_critical_section->version).version);
              local_68.lock = (optimistic_lock *)0x0;
              if (bVar8) {
                local_68.lock = child_critical_section->lock;
              }
              child_critical_section->lock = (optimistic_lock *)0x0;
              if (local_68.lock != (optimistic_lock *)0x0) {
                olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
                init((olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                      *)node_guard.lock,(EVP_PKEY_CTX *)child_guard_1.lock);
                wVar7 = node_guard;
                node_guard.lock = (optimistic_lock *)0x0;
                if (((ulong)wVar7.lock & 7) != 0) {
                  __assert_fail("(result & ptr_bit_mask) == uintptr",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                                ,0x182,
                                "static std::uintptr_t unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr(const Header *, unodb::node_type) [Header = unodb::detail::olc_node_header]"
                               );
                }
                (node_in_parent->value)._M_i.tagged_ptr = (ulong)wVar7.lock | 2;
                if (local_40.lock != (optimistic_lock *)0x0) {
                  __assert_fail("!node_guard.active()",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                ,0x644,
                                "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_48<unsigned long, std::span<const std::byte>>]"
                               );
                }
                if (local_68.lock != (optimistic_lock *)0x0) {
                  __assert_fail("!child_guard.active()",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                ,0x645,
                                "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_48<unsigned long, std::span<const std::byte>>]"
                               );
                }
                *child_in_parent =
                     (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                      *)0x0;
                optimistic_lock::write_guard::~write_guard(&local_68);
                optimistic_lock::write_guard::~write_guard(&local_40);
                optimistic_lock::write_guard::~write_guard(&node_guard_1);
                std::
                unique_ptr<unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                               *)&stack0xffffffffffffffa8);
                LOCK();
                child_guard_1.lock[0x1b].read_lock_count.super___atomic_base<long>._M_i =
                     child_guard_1.lock[0x1b].read_lock_count.super___atomic_base<long>._M_i + 1;
                UNLOCK();
                goto LAB_0022979f;
              }
              optimistic_lock::write_guard::~write_guard(&local_68);
            }
            optimistic_lock::write_guard::~write_guard(&local_40);
          }
          optimistic_lock::write_guard::~write_guard(&node_guard_1);
          std::
          unique_ptr<unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         *)&stack0xffffffffffffffa8);
        }
        else {
          poVar13 = parent_critical_section->lock;
          _Var5 = (parent_critical_section->version).version;
          if ((poVar13->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00229b75;
          _Var6 = (poVar13->version).version.super___atomic_base<unsigned_long>._M_i;
          LOCK();
          paVar1 = &poVar13->read_lock_count;
          lVar12 = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if (_Var5 != _Var6) goto LAB_00229a0e;
          if (lVar12 < 1) goto LAB_00229b94;
          parent_critical_section->lock = (optimistic_lock *)0x0;
          poVar13 = node_critical_section->lock;
          _Var5 = (node_critical_section->version).version;
          if ((poVar13->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00229b75;
          _Var6 = (poVar13->version).version.super___atomic_base<unsigned_long>._M_i;
          LOCK();
          paVar1 = &poVar13->read_lock_count;
          lVar12 = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if (_Var5 == _Var6) {
            if (lVar12 < 1) goto LAB_00229b94;
            node_critical_section->lock = (optimistic_lock *)0x0;
            poVar13 = child_critical_section->lock;
            _Var5 = (child_critical_section->version).version;
            if ((poVar13->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00229b75;
            _Var6 = (poVar13->version).version.super___atomic_base<unsigned_long>._M_i;
            LOCK();
            paVar1 = &poVar13->read_lock_count;
            lVar12 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            node_critical_section = child_critical_section;
            if (_Var5 == _Var6) {
              if (lVar12 < 1) goto LAB_00229b94;
              child_critical_section->lock = (optimistic_lock *)0x0;
              goto LAB_00229904;
            }
          }
          if (lVar12 < 1) goto LAB_00229b94;
          node_critical_section->lock = (optimistic_lock *)0x0;
        }
      }
      else {
        *child_in_parent = piVar2;
        poVar13 = parent_critical_section->lock;
        _Var5 = (parent_critical_section->version).version;
        if ((poVar13->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00229b75;
        _Var6 = (poVar13->version).version.super___atomic_base<unsigned_long>._M_i;
        LOCK();
        paVar1 = &poVar13->read_lock_count;
        lVar12 = (paVar1->super___atomic_base<long>)._M_i;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if (_Var5 == _Var6) {
          if (lVar12 < 1) goto LAB_00229b94;
          parent_critical_section->lock = (optimistic_lock *)0x0;
LAB_0022979f:
          uVar14 = 0x100;
LAB_002297a4:
          uVar9 = 1;
          goto LAB_0022990b;
        }
LAB_00229a0e:
        if (lVar12 < 1) {
LAB_00229b94:
          __assert_fail("old_value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
        }
        parent_critical_section->lock = (optimistic_lock *)0x0;
      }
    }
  }
  uVar9 = 0;
  uVar14 = 0;
LAB_0022990b:
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar14 | uVar9);
}

Assistant:

[[nodiscard]] std::optional<bool> olc_impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    olc_db<Key, Value>& db_instance,
    optimistic_lock::read_critical_section& parent_critical_section,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    in_critical_section<olc_node_ptr>** child_in_parent,
    optimistic_lock::read_critical_section* child_critical_section,
    node_type* child_type, olc_node_ptr* child) {
  const auto [child_i, found_child]{inode.find_child(key_byte)};

  if (found_child == nullptr) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  *child = found_child->load();

  if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check())) return {};

  auto& child_lock{node_ptr_lock(*child)};
  *child_critical_section = child_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(child_critical_section->must_restart())) return {};

  *child_type = child->type();

  if (*child_type != node_type::LEAF) {
    *child_in_parent = found_child;
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    return true;
  }

  const auto* const leaf{child->ptr<olc_leaf_type<Key, Value>*>()};
  if (!leaf->matches(k)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!child_critical_section->try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  const auto is_node_min_size{inode.is_min_size()};

  if (UNODB_DETAIL_LIKELY(!is_node_min_size)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const optimistic_lock::write_guard node_guard{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    child_guard.unlock_and_obsolete();

    inode.remove(child_i, db_instance);

    *child_in_parent = nullptr;
    return true;
  }

  UNODB_DETAIL_ASSERT(is_node_min_size);

  if constexpr (std::is_same_v<INode, olc_inode_4<Key, Value>>) {
    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    auto current_node{olc_art_policy<Key, Value>::make_db_inode_reclaimable_ptr(
        &inode, db_instance)};
    node_guard.unlock_and_obsolete();
    child_guard.unlock_and_obsolete();
    *node_in_parent = current_node->leave_last_child(child_i, db_instance);

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  } else {
    auto smaller_node{INode::smaller_derived_type::create(db_instance, inode)};

    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    smaller_node->init(db_instance, inode, node_guard, child_i, child_guard);
    *node_in_parent = detail::olc_node_ptr{smaller_node.release(),
                                           INode::smaller_derived_type::type};

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  }

#ifdef UNODB_DETAIL_WITH_STATS
  db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS

  return true;
}